

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_name.cc
# Opt level: O1

string * absl::flags_internal::ProgramInvocationName_abi_cxx11_(void)

{
  long lVar1;
  string *in_RDI;
  
  Mutex::Lock((Mutex *)&program_name_guard);
  lVar1 = program_name_abi_cxx11_;
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (lVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    std::__cxx11::string::_M_construct<char*>();
  }
  Mutex::Unlock((Mutex *)&program_name_guard);
  return in_RDI;
}

Assistant:

std::string ProgramInvocationName() {
  absl::MutexLock l(&program_name_guard);

  return program_name ? *program_name : "UNKNOWN";
}